

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

int __thiscall
Fl_PostScript_Graphics_Driver::clocale_printf(Fl_PostScript_Graphics_Driver *this,char *format,...)

{
  char in_AL;
  int iVar1;
  char *__locale;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  __locale = setlocale(1,(char *)0x0);
  setlocale(1,"C");
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  args[0].reg_save_area = local_d8;
  iVar1 = vfprintf((FILE *)this->output,format,args);
  setlocale(1,__locale);
  return iVar1;
}

Assistant:

int Fl_PostScript_Graphics_Driver::clocale_printf(const char *format, ...)
{
  char *saved_locale = setlocale(LC_NUMERIC, NULL);
  setlocale(LC_NUMERIC, "C");
  va_list args;
  va_start(args, format);
  int retval = vfprintf(output, format, args);
  va_end(args);
  setlocale(LC_NUMERIC, saved_locale);
  return retval;
}